

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# activation.cpp
# Opt level: O2

void __thiscall Activation::TracePointers(Activation *this,function<void_(Sexp_**)> *func)

{
  pointer ppSVar1;
  size_t i;
  ulong uVar2;
  pointer __args;
  
  ppSVar1 = (this->slots).super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  __args = ppSVar1;
  for (uVar2 = 0;
      uVar2 < (ulong)((long)(this->slots).super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)ppSVar1 >> 3);
      uVar2 = uVar2 + 1) {
    if (*__args != (Sexp *)0x0) {
      std::function<void_(Sexp_**)>::operator()(func,__args);
      ppSVar1 = (this->slots).super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    }
    __args = __args + 1;
  }
  if (this->parent != (Sexp *)0x0) {
    std::function<void_(Sexp_**)>::operator()(func,&this->parent);
    return;
  }
  return;
}

Assistant:

void Activation::TracePointers(std::function<void(Sexp **)> func) {
  Sexp **data = slots.data();
  for (size_t i = 0; i < slots.size(); i++) {
    if (data[i] != nullptr) {
      func(&data[i]);
    }
  }

  if (parent != nullptr) {
    func(&parent);
  }
}